

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O2

Spline * createSpline_38219(SplineStack *ss,float f,int bl)

{
  Spline *pSVar1;
  Spline *pSVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float f0;
  float fVar10;
  float fVar11;
  float fVar12;
  
  iVar5 = ss->len;
  ss->len = iVar5 + 1;
  pSVar1 = ss->stack + iVar5;
  ss->stack[iVar5].typ = 2;
  fVar7 = (1.0 - f) * 0.5;
  fVar10 = 1.0 - fVar7;
  fVar9 = (1.0 - f) * -0.5;
  fVar8 = fVar10 * 0.07834099 + fVar9;
  if (fVar8 <= -0.2222) {
    fVar8 = -0.2222;
  }
  fVar6 = fVar10 + fVar9;
  fVar7 = fVar7 / (fVar10 * 0.46082947) + -1.17;
  if (fVar6 <= 0.0) {
    fVar6 = 0.0;
  }
  if ((fVar7 <= -0.65) || (1.0 <= fVar7)) {
    fVar9 = (fVar6 - fVar8) * 0.5;
    if (bl == 0) {
      iVar3 = ss->flen;
      iVar4 = iVar3 + 1;
      ((Spline *)(ss->fstack + iVar3))->len = 1;
      ss->fstack[iVar3].val = fVar8;
      iVar5 = pSVar1->len;
      pSVar1->loc[iVar5] = -1.0;
      pSVar1->val[iVar5] = (Spline *)(ss->fstack + iVar3);
      pSVar1->der[iVar5] = fVar9;
      iVar5 = iVar5 + 1;
    }
    else {
      fVar7 = fVar8;
      if (fVar8 <= 0.2) {
        fVar7 = 0.2;
      }
      iVar3 = ss->flen;
      ss->flen = iVar3 + 1;
      ((Spline *)(ss->fstack + iVar3))->len = 1;
      ss->fstack[iVar3].val = fVar7;
      iVar5 = pSVar1->len;
      pSVar1->loc[iVar5] = -1.0;
      pSVar1->val[iVar5] = (Spline *)(ss->fstack + iVar3);
      pSVar1->der[iVar5] = 0.0;
      pSVar1->len = iVar5 + 1;
      ((Spline *)(ss->fstack + (long)iVar3 + 1))->len = 1;
      ss->fstack[(long)iVar3 + 1].val = (fVar6 - fVar8) * 0.5 + fVar8;
      pSVar1->loc[(long)iVar5 + 1] = 0.0;
      iVar4 = iVar3 + 2;
      pSVar1->val[(long)iVar5 + 1] = (Spline *)(ss->fstack + (long)iVar3 + 1);
      pSVar1->der[(long)iVar5 + 1] = fVar9;
      iVar5 = iVar5 + 2;
    }
    ss->flen = iVar4 + 1;
    ((Spline *)(ss->fstack + iVar4))->len = 1;
    ss->fstack[iVar4].val = fVar6;
    pSVar1->loc[iVar5] = 1.0;
    pSVar1->val[iVar5] = (Spline *)(ss->fstack + iVar4);
    pSVar1->der[iVar5] = fVar9;
  }
  else {
    fVar11 = fVar10 * 0.23963131 + fVar9;
    fVar12 = fVar10 * 0.19354835 + fVar9;
    if (fVar12 <= -0.2222) {
      fVar12 = -0.2222;
    }
    if (fVar11 <= 0.0) {
      fVar11 = 0.0;
    }
    fVar9 = (fVar7 + 1.17) * 0.46082947 * fVar10 + fVar9;
    fVar10 = (float)(-(uint)(fVar7 < -0.7) & 0xbe638866);
    if (fVar9 <= fVar10) {
      fVar9 = fVar10;
    }
    iVar3 = ss->flen;
    pSVar2 = (Spline *)(ss->fstack + iVar3);
    pSVar2->len = 1;
    pSVar2->typ = (int)fVar8;
    iVar4 = pSVar1->len;
    pSVar1->loc[iVar4] = -1.0;
    pSVar1->val[iVar4] = pSVar2;
    pSVar1->der[iVar4] = (fVar12 - fVar8) * 4.0;
    pSVar2 = (Spline *)(ss->fstack + (long)iVar3 + 1);
    pSVar2->len = 1;
    pSVar2->typ = (int)fVar12;
    pSVar1->loc[(long)iVar4 + 1] = -0.75;
    pSVar1->val[(long)iVar4 + 1] = pSVar2;
    pSVar1->der[(long)iVar4 + 1] = 0.0;
    ((Spline *)(ss->fstack + (long)iVar3 + 2))->len = 1;
    ss->fstack[(long)iVar3 + 2].val = fVar11;
    pSVar1->loc[(long)iVar4 + 2] = -0.65;
    pSVar1->val[(long)iVar4 + 2] = (Spline *)(ss->fstack + (long)iVar3 + 2);
    pSVar1->der[(long)iVar4 + 2] = 0.0;
    fVar8 = (fVar6 - fVar9) / (1.0 - fVar7);
    ((Spline *)(ss->fstack + (long)iVar3 + 3))->len = 1;
    ss->fstack[(long)iVar3 + 3].val = fVar9;
    pSVar1->loc[(long)iVar4 + 3] = fVar7 + -0.01;
    pSVar1->val[(long)iVar4 + 3] = (Spline *)(ss->fstack + (long)iVar3 + 3);
    pSVar1->der[(long)iVar4 + 3] = 0.0;
    pSVar1->len = iVar4 + 4;
    ((Spline *)(ss->fstack + (long)iVar3 + 4))->len = 1;
    ss->fstack[(long)iVar3 + 4].val = fVar9;
    pSVar1->loc[(long)iVar4 + 4] = fVar7;
    pSVar1->val[(long)iVar4 + 4] = (Spline *)(ss->fstack + (long)iVar3 + 4);
    pSVar1->der[(long)iVar4 + 4] = fVar8;
    iVar5 = iVar4 + 5;
    ss->flen = iVar3 + 6;
    pSVar2 = (Spline *)(ss->fstack + (long)iVar3 + 5);
    pSVar2->len = 1;
    pSVar2->typ = (int)fVar6;
    pSVar1->loc[(long)iVar4 + 5] = 1.0;
    pSVar1->val[(long)iVar4 + 5] = pSVar2;
    pSVar1->der[(long)iVar4 + 5] = fVar8;
  }
  pSVar1->len = iVar5 + 1;
  return pSVar1;
}

Assistant:

static Spline *createSpline_38219(SplineStack *ss, float f, int bl)
{
    Spline *sp = &ss->stack[ss->len++];
    sp->typ = SP_RIDGES;

    float i = getOffsetValue(-1.0F, f);
    float k = getOffsetValue( 1.0F, f);
    float l = 1.0F - (1.0F - f) * 0.5F;
    float u = 0.5F * (1.0F - f);
    l = u / (0.46082947F * l) - 1.17F;

    if (-0.65F < l && l < 1.0F)
    {
        float p, q, r, s;
        u = getOffsetValue(-0.65F, f);
        p = getOffsetValue(-0.75F, f);
        q = (p - i) * 4.0F;
        r = getOffsetValue(l, f);
        s = (k - r) / (1.0F - l);

        addSplineVal(sp, -1.0F,     createFixSpline(ss, i), q);
        addSplineVal(sp, -0.75F,    createFixSpline(ss, p), 0);
        addSplineVal(sp, -0.65F,    createFixSpline(ss, u), 0);
        addSplineVal(sp, l-0.01F,   createFixSpline(ss, r), 0);
        addSplineVal(sp, l,         createFixSpline(ss, r), s);
        addSplineVal(sp, 1.0F,      createFixSpline(ss, k), s);
    }
    else
    {
        u = (k - i) * 0.5F;
        if (bl) {
            addSplineVal(sp, -1.0F, createFixSpline(ss, i > 0.2 ? i : 0.2), 0);
            addSplineVal(sp,  0.0F, createFixSpline(ss, lerp(0.5F, i, k)), u);
        } else {
            addSplineVal(sp, -1.0F, createFixSpline(ss, i), u);
        }
        addSplineVal(sp, 1.0F,      createFixSpline(ss, k), u);
    }
    return sp;
}